

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O1

void __thiscall filesystem::path::path(path *this,string *p)

{
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  NormalizePath(this);
  return;
}

Assistant:

path(const std::string& p) : path()
    {
        this->path_ = p;
        NormalizePath();
    }